

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void yl_log(ly_bool err,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 uVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined4 local_138;
  undefined4 local_134;
  va_list ap;
  char local_118 [8];
  char msg [256];
  char *format_local;
  ly_bool err_local;
  
  if (in_AL != '\0') {
    local_1b8 = in_XMM0_Qa;
    local_1a8 = in_XMM1_Qa;
    local_198 = in_XMM2_Qa;
    local_188 = in_XMM3_Qa;
    local_178 = in_XMM4_Qa;
    local_168 = in_XMM5_Qa;
    local_158 = in_XMM6_Qa;
    local_148 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_1e8;
  ap[0]._0_8_ = &stack0x00000008;
  local_134 = 0x30;
  local_138 = 0x10;
  local_1d8 = in_RDX;
  local_1d0 = in_RCX;
  local_1c8 = in_R8;
  local_1c0 = in_R9;
  msg._248_8_ = format;
  vsnprintf(local_118,0x100,format,&local_138);
  uVar1 = 0x57;
  if (err != '\0') {
    uVar1 = 0x45;
  }
  fprintf(_stderr,"YANGLINT[%c]: %s\n",uVar1,local_118);
  return;
}

Assistant:

void
yl_log(ly_bool err, const char *format, ...)
{
    char msg[256];
    va_list ap;

    va_start(ap, format);
    vsnprintf(msg, 256, format, ap);
    va_end(ap);

    fprintf(stderr, "YANGLINT[%c]: %s\n", err ? 'E' : 'W', msg);
}